

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O1

void stbir__encode_uint8_linear(void *outputp,int width_times_channels,float *encode)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  undefined1 auVar11 [16];
  float *pfVar12;
  uchar *output;
  undefined8 *puVar13;
  float *pfVar14;
  float fVar15;
  float fVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  
  auVar11 = _DAT_00619ac0;
  puVar2 = (undefined8 *)((long)outputp + (long)width_times_channels);
  if (width_times_channels < 8) {
    if (3 < width_times_channels) {
      do {
        auVar18._0_4_ = *encode + 0.5;
        auVar18._4_4_ = encode[1] + 0.5;
        auVar18._8_4_ = encode[2] + 0.5;
        auVar18._12_4_ = encode[3] + 0.5;
        auVar18 = minps(auVar18,auVar11);
        auVar18 = maxps(auVar18,ZEXT816(0));
        auVar21._0_4_ = (int)auVar18._0_4_;
        auVar21._4_4_ = (int)auVar18._4_4_;
        auVar21._8_4_ = (int)auVar18._8_4_;
        auVar21._12_4_ = (int)auVar18._12_4_;
        auVar18 = packssdw(auVar21,auVar21);
        sVar3 = auVar18._0_2_;
        sVar4 = auVar18._2_2_;
        sVar5 = auVar18._4_2_;
        sVar6 = auVar18._6_2_;
        *(uint *)outputp =
             CONCAT13((0 < sVar6) * (sVar6 < 0x100) * auVar18[6] - (0xff < sVar6),
                      CONCAT12((0 < sVar5) * (sVar5 < 0x100) * auVar18[4] - (0xff < sVar5),
                               CONCAT11((0 < sVar4) * (sVar4 < 0x100) * auVar18[2] - (0xff < sVar4),
                                        (0 < sVar3) * (sVar3 < 0x100) * auVar18[0] - (0xff < sVar3))
                              ));
        encode = encode + 4;
        puVar1 = (undefined8 *)((long)outputp + 4);
        puVar13 = (undefined8 *)((long)outputp + 8);
        outputp = puVar1;
      } while (puVar13 <= puVar2);
    }
    for (; outputp < puVar2; outputp = (undefined8 *)((long)outputp + 1)) {
      fVar16 = 0.0;
      if (0.0 <= *encode + 0.5) {
        fVar16 = *encode + 0.5;
      }
      fVar15 = 255.0;
      if (fVar16 <= 255.0) {
        fVar15 = fVar16;
      }
      *(char *)outputp = (char)(int)fVar15;
      encode = encode + 1;
    }
  }
  else {
    pfVar12 = encode;
    do {
      puVar1 = (undefined8 *)((long)outputp + 8);
      puVar13 = puVar2 + -1;
      if (puVar1 == puVar2) {
        puVar13 = puVar1;
      }
      pfVar14 = encode + (long)width_times_channels + -8;
      if (puVar1 == puVar2) {
        pfVar14 = pfVar12 + 8;
      }
      if (puVar1 <= puVar2 + -1) {
        pfVar14 = pfVar12 + 8;
        puVar13 = puVar1;
      }
      auVar17._0_4_ = *pfVar12 + 0.5;
      auVar17._4_4_ = pfVar12[1] + 0.5;
      auVar17._8_4_ = pfVar12[2] + 0.5;
      auVar17._12_4_ = pfVar12[3] + 0.5;
      auVar20._0_4_ = pfVar12[4] + 0.5;
      auVar20._4_4_ = pfVar12[5] + 0.5;
      auVar20._8_4_ = pfVar12[6] + 0.5;
      auVar20._12_4_ = pfVar12[7] + 0.5;
      auVar18 = minps(auVar17,auVar11);
      auVar21 = minps(auVar20,auVar11);
      auVar18 = maxps(auVar18,ZEXT816(0));
      auVar21 = maxps(auVar21,ZEXT816(0));
      auVar19._0_4_ = (int)auVar18._0_4_;
      auVar19._4_4_ = (int)auVar18._4_4_;
      auVar19._8_4_ = (int)auVar18._8_4_;
      auVar19._12_4_ = (int)auVar18._12_4_;
      auVar22._0_4_ = (int)auVar21._0_4_;
      auVar22._4_4_ = (int)auVar21._4_4_;
      auVar22._8_4_ = (int)auVar21._8_4_;
      auVar22._12_4_ = (int)auVar21._12_4_;
      auVar18 = packssdw(auVar19,auVar22);
      sVar3 = auVar18._0_2_;
      sVar4 = auVar18._2_2_;
      sVar5 = auVar18._4_2_;
      sVar6 = auVar18._6_2_;
      sVar7 = auVar18._8_2_;
      sVar8 = auVar18._10_2_;
      sVar9 = auVar18._12_2_;
      sVar10 = auVar18._14_2_;
      *(ulong *)outputp =
           CONCAT17((0 < sVar10) * (sVar10 < 0x100) * auVar18[0xe] - (0xff < sVar10),
                    CONCAT16((0 < sVar9) * (sVar9 < 0x100) * auVar18[0xc] - (0xff < sVar9),
                             CONCAT15((0 < sVar8) * (sVar8 < 0x100) * auVar18[10] - (0xff < sVar8),
                                      CONCAT14((0 < sVar7) * (sVar7 < 0x100) * auVar18[8] -
                                               (0xff < sVar7),
                                               CONCAT13((0 < sVar6) * (sVar6 < 0x100) * auVar18[6] -
                                                        (0xff < sVar6),
                                                        CONCAT12((0 < sVar5) * (sVar5 < 0x100) *
                                                                 auVar18[4] - (0xff < sVar5),
                                                                 CONCAT11((0 < sVar4) *
                                                                          (sVar4 < 0x100) *
                                                                          auVar18[2] -
                                                                          (0xff < sVar4),
                                                                          (0 < sVar3) *
                                                                          (sVar3 < 0x100) *
                                                                          auVar18[0] -
                                                                          (0xff < sVar3))))))));
      pfVar12 = pfVar14;
      outputp = puVar13;
    } while (puVar1 != puVar2);
  }
  return;
}

Assistant:

static void STBIR__CODER_NAME( stbir__encode_uint8_linear )( void * outputp, int width_times_channels, float const * encode )
{
  unsigned char STBIR_SIMD_STREAMOUT_PTR( * ) output = (unsigned char *) outputp;
  unsigned char * end_output = ( (unsigned char *) output ) + width_times_channels;

  #ifdef STBIR_SIMD
  if ( width_times_channels >= stbir__simdfX_float_count*2 )
  {
    float const * end_encode_m8 = encode + width_times_channels - stbir__simdfX_float_count*2;
    end_output -= stbir__simdfX_float_count*2;
    STBIR_SIMD_NO_UNROLL_LOOP_START_INF_FOR
    for(;;)
    {
      stbir__simdfX e0, e1;
      stbir__simdi i;
      STBIR_SIMD_NO_UNROLL(encode);
      stbir__simdfX_add_mem( e0, STBIR_simd_point5X, encode );
      stbir__simdfX_add_mem( e1, STBIR_simd_point5X, encode+stbir__simdfX_float_count );
      stbir__encode_simdfX_unflip( e0 );
      stbir__encode_simdfX_unflip( e1 );
      #ifdef STBIR_SIMD8
      stbir__simdf8_pack_to_16bytes( i, e0, e1 );
      stbir__simdi_store( output, i );
      #else
      stbir__simdf_pack_to_8bytes( i, e0, e1 );
      stbir__simdi_store2( output, i );
      #endif
      encode += stbir__simdfX_float_count*2;
      output += stbir__simdfX_float_count*2;
      if ( output <= end_output )
        continue;
      if ( output == ( end_output + stbir__simdfX_float_count*2 ) )
        break;
      output = end_output; // backup and do last couple
      encode = end_encode_m8;
    }
    return;
  }

  // try to do blocks of 4 when you can
  #if stbir__coder_min_num != 3 // doesn't divide cleanly by four
  output += 4;
  STBIR_NO_UNROLL_LOOP_START
  while( output <= end_output )
  {
    stbir__simdf e0;
    stbir__simdi i0;
    STBIR_NO_UNROLL(encode);
    stbir__simdf_load( e0, encode );
    stbir__simdf_add( e0, STBIR__CONSTF(STBIR_simd_point5), e0 );
    stbir__encode_simdf4_unflip( e0 );
    stbir__simdf_pack_to_8bytes( i0, e0, e0 );  // only use first 4
    *(int*)(output-4) = stbir__simdi_to_int( i0 );
    output += 4;
    encode += 4;
  }
  output -= 4;
  #endif

  #else

  // try to do blocks of 4 when you can
  #if stbir__coder_min_num != 3 // doesn't divide cleanly by four
  output += 4;
  while( output <= end_output )
  {
    float f;
    f = encode[stbir__encode_order0] + 0.5f; STBIR_CLAMP(f, 0, 255); output[0-4] = (unsigned char)f;
    f = encode[stbir__encode_order1] + 0.5f; STBIR_CLAMP(f, 0, 255); output[1-4] = (unsigned char)f;
    f = encode[stbir__encode_order2] + 0.5f; STBIR_CLAMP(f, 0, 255); output[2-4] = (unsigned char)f;
    f = encode[stbir__encode_order3] + 0.5f; STBIR_CLAMP(f, 0, 255); output[3-4] = (unsigned char)f;
    output += 4;
    encode += 4;
  }
  output -= 4;
  #endif

  #endif

  // do the remnants
  #if stbir__coder_min_num < 4
  STBIR_NO_UNROLL_LOOP_START
  while( output < end_output )
  {
    float f;
    STBIR_NO_UNROLL(encode);
    f = encode[stbir__encode_order0] + 0.5f; STBIR_CLAMP(f, 0, 255); output[0] = (unsigned char)f;
    #if stbir__coder_min_num >= 2
    f = encode[stbir__encode_order1] + 0.5f; STBIR_CLAMP(f, 0, 255); output[1] = (unsigned char)f;
    #endif
    #if stbir__coder_min_num >= 3
    f = encode[stbir__encode_order2] + 0.5f; STBIR_CLAMP(f, 0, 255); output[2] = (unsigned char)f;
    #endif
    output += stbir__coder_min_num;
    encode += stbir__coder_min_num;
  }
  #endif
}